

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_initCStream_usingCDict(ZSTD_CStream *zcs,ZSTD_CDict *cdict)

{
  size_t sVar1;
  
  zcs->streamStage = zcss_init;
  zcs->pledgedSrcSizePlusOne = 0;
  sVar1 = ZSTD_CCtx_refCDict(zcs,cdict);
  if (sVar1 < 0xffffffffffffff89) {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_CCtx_reset(ZSTD_CCtx* cctx, ZSTD_ResetDirective reset)
{
    if ( (reset == ZSTD_reset_session_only)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        cctx->streamStage = zcss_init;
        cctx->pledgedSrcSizePlusOne = 0;
    }
    if ( (reset == ZSTD_reset_parameters)
      || (reset == ZSTD_reset_session_and_parameters) ) {
        RETURN_ERROR_IF(cctx->streamStage != zcss_init, stage_wrong,
                        "Can't reset parameters only when not in init stage.");
        ZSTD_clearAllDicts(cctx);
        return ZSTD_CCtxParams_reset(&cctx->requestedParams);
    }
    return 0;
}